

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestinitiatorFixtureQueuedLogonMessages::TestinitiatorFixtureQueuedLogonMessages
          (TestinitiatorFixtureQueuedLogonMessages *this)

{
  char *suiteName;
  TestinitiatorFixtureQueuedLogonMessages *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"QueuedLogonMessages",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0xa76);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestinitiatorFixtureQueuedLogonMessages_0045b930;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, QueuedLogonMessages)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 2 );
  object->next(receivedLogon, UtcTimeStamp(), true);

  for( int i = 3; i <= 6; ++i )
  {
      object->next( createNewOrderSingle( "ISLD", "TW", i), UtcTimeStamp() );
  }
  CHECK_EQUAL( 1, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toResendRequest );

  object->next( createNewOrderSingle( "ISLD", "TW", 1), UtcTimeStamp() );
  CHECK_EQUAL( 1, toResendRequest );
  CHECK_EQUAL( 7, object->getExpectedTargetNum() );
}